

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

maybe<example::aln_t> * __thiscall
rangeless::fn::impl::
catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>
::operator()(maybe<example::aln_t> *__return_storage_ptr__,
            catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>
            *this)

{
  exception *anon_var_0;
  aln_t local_98;
  catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>
  *local_18;
  catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>
  *this_local;
  
  local_18 = this;
  this_local = (catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>
                *)__return_storage_ptr__;
  if ((this->ended & 1U) == 0) {
    anon_class_16_2_d6ff961e_for_gen::operator()(&local_98,&this->gen);
    maybe<example::aln_t>::maybe(__return_storage_ptr__,&local_98);
    example::aln_t::~aln_t(&local_98);
  }
  else {
    maybe<example::aln_t>::maybe(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator()() -> maybe<value_type>
        {
            if(ended) {
                return { };
            }

            try {
                return { gen() };
            } catch( const end_seq::exception& ) {
                ended = true;
                return { };
            }
        }